

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O1

void kj::UnixEventPort::registerSignalHandler(int signum)

{
  int iVar1;
  Fault f_4;
  Fault f_1;
  sigaction action;
  sigset_t mask;
  Fault local_150;
  Fault local_148;
  undefined8 uStack_140;
  _union_1457 local_138;
  sigset_t sStack_130;
  undefined4 local_b0;
  sigset_t local_98;
  
  if (((uint)signum < 0xc) && ((0x990U >> (signum & 0x1fU) & 1) != 0)) {
    local_98.__val[0]._0_1_ = 0;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&,char_const(&)[93]>
              ((Fault *)&local_138,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
               ,0xba,FAILED,
               "signum != SIGBUS && signum != SIGFPE && signum != SIGILL && signum != SIGSEGV",
               "_kjCondition,\"this signal is raised by erroneous code execution; you cannot capture it into the event \" \"loop\""
               ,(bool *)&local_98,
               (char (*) [93])
               "this signal is raised by erroneous code execution; you cannot capture it into the event loop"
              );
    kj::_::Debug::Fault::fatal((Fault *)&local_138);
  }
  (anonymous_namespace)::tooLateToSetReserved = 1;
  do {
    iVar1 = sigemptyset(&local_98);
    if (-1 < iVar1) {
      iVar1 = 0;
      break;
    }
    iVar1 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    local_148.exception = (Exception *)0x0;
    local_138.sa_handler = (__sighandler_t)0x0;
    sStack_130.__val[0] = 0;
    kj::_::Debug::Fault::init
              (&local_148,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
              );
    kj::_::Debug::Fault::fatal(&local_148);
  }
  do {
    iVar1 = sigaddset(&local_98,signum);
    if (-1 < iVar1) {
      iVar1 = 0;
      break;
    }
    iVar1 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    local_148.exception = (Exception *)0x0;
    local_138.sa_handler = (__sighandler_t)0x0;
    sStack_130.__val[0] = 0;
    kj::_::Debug::Fault::init
              (&local_148,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
              );
    kj::_::Debug::Fault::fatal(&local_148);
  }
  do {
    iVar1 = pthread_sigmask(0,&local_98,(__sigset_t *)0x0);
    if (-1 < iVar1) {
      iVar1 = 0;
      break;
    }
    iVar1 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    local_148.exception = (Exception *)0x0;
    local_138.sa_handler = (__sighandler_t)0x0;
    sStack_130.__val[0] = 0;
    kj::_::Debug::Fault::init
              (&local_148,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
              );
    kj::_::Debug::Fault::fatal(&local_148);
  }
  memset(&local_138,0,0x98);
  local_138.sa_handler = signalHandler;
  local_b0 = 4;
  do {
    iVar1 = sigfillset(&sStack_130);
    if (-1 < iVar1) {
      iVar1 = 0;
      break;
    }
    iVar1 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    local_150.exception = (Exception *)0x0;
    local_148.exception = (Exception *)0x0;
    uStack_140 = 0;
    kj::_::Debug::Fault::init
              (&local_150,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
              );
    kj::_::Debug::Fault::fatal(&local_150);
  }
  do {
    iVar1 = sigdelset(&sStack_130,7);
    if (-1 < iVar1) {
      iVar1 = 0;
      break;
    }
    iVar1 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    local_150.exception = (Exception *)0x0;
    local_148.exception = (Exception *)0x0;
    uStack_140 = 0;
    kj::_::Debug::Fault::init
              (&local_150,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
              );
    kj::_::Debug::Fault::fatal(&local_150);
  }
  do {
    iVar1 = sigdelset(&sStack_130,8);
    if (-1 < iVar1) {
      iVar1 = 0;
      break;
    }
    iVar1 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    local_150.exception = (Exception *)0x0;
    local_148.exception = (Exception *)0x0;
    uStack_140 = 0;
    kj::_::Debug::Fault::init
              (&local_150,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
              );
    kj::_::Debug::Fault::fatal(&local_150);
  }
  do {
    iVar1 = sigdelset(&sStack_130,4);
    if (-1 < iVar1) {
      iVar1 = 0;
      break;
    }
    iVar1 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    local_150.exception = (Exception *)0x0;
    local_148.exception = (Exception *)0x0;
    uStack_140 = 0;
    kj::_::Debug::Fault::init
              (&local_150,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
              );
    kj::_::Debug::Fault::fatal(&local_150);
  }
  do {
    iVar1 = sigdelset(&sStack_130,0xb);
    if (-1 < iVar1) {
      iVar1 = 0;
      break;
    }
    iVar1 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    local_150.exception = (Exception *)0x0;
    local_148.exception = (Exception *)0x0;
    uStack_140 = 0;
    kj::_::Debug::Fault::init
              (&local_150,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
              );
    kj::_::Debug::Fault::fatal(&local_150);
  }
  do {
    iVar1 = sigaction(signum,(sigaction *)&local_138,(sigaction *)0x0);
    if (-1 < iVar1) {
      iVar1 = 0;
      break;
    }
    iVar1 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    local_150.exception = (Exception *)0x0;
    local_148.exception = (Exception *)0x0;
    uStack_140 = 0;
    kj::_::Debug::Fault::init
              (&local_150,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
              );
    kj::_::Debug::Fault::fatal(&local_150);
  }
  return;
}

Assistant:

void UnixEventPort::registerSignalHandler(int signum) {
  KJ_REQUIRE(signum != SIGBUS && signum != SIGFPE && signum != SIGILL && signum != SIGSEGV,
      "this signal is raised by erroneous code execution; you cannot capture it into the event "
      "loop");

  tooLateToSetReserved = true;

  // Block the signal from being delivered most of the time. We'll explicitly unblock it when we
  // want to receive it.
  sigset_t mask;
  KJ_SYSCALL(sigemptyset(&mask));
  KJ_SYSCALL(sigaddset(&mask, signum));
  KJ_SYSCALL(pthread_sigmask(SIG_BLOCK, &mask, nullptr));

  // Register the signal handler which should be invoked when we explicitly unblock the signal.
  struct sigaction action;
  memset(&action, 0, sizeof(action));
  action.sa_sigaction = &signalHandler;
  action.sa_flags = SA_SIGINFO;

  // Set up the signal mask applied while the signal handler runs. We want to block all other
  // signals from being raised during the handler, with the exception of the four "crash" signals,
  // which realistically can't be blocked.
  KJ_SYSCALL(sigfillset(&action.sa_mask));
  KJ_SYSCALL(sigdelset(&action.sa_mask, SIGBUS));
  KJ_SYSCALL(sigdelset(&action.sa_mask, SIGFPE));
  KJ_SYSCALL(sigdelset(&action.sa_mask, SIGILL));
  KJ_SYSCALL(sigdelset(&action.sa_mask, SIGSEGV));

  KJ_SYSCALL(sigaction(signum, &action, nullptr));
}